

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O3

Float __thiscall pbrt::Image::GetChannel(Image *this,Point2i p,int c,WrapMode2D wrapMode)

{
  ushort uVar1;
  PixelFormat PVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  float fVar8;
  span<const_unsigned_char> vin;
  span<const_unsigned_char> vin_00;
  span<float> vout;
  span<float> vout_00;
  Float r;
  float local_1c;
  Tuple2<pbrt::Point2,_int> local_18;
  
  local_18 = p.super_Tuple2<pbrt::Point2,_int>;
  bVar4 = RemapPixelCoords((Point2i *)&local_18,
                           (Point2i)(this->resolution).super_Tuple2<pbrt::Point2,_int>,wrapMode);
  fVar8 = 0.0;
  if (bVar4) {
    PVar2 = this->format;
    iVar5 = local_18.x;
    iVar6 = local_18.y;
    if (PVar2 == Float) {
      fVar8 = (this->p32).ptr
              [(long)((iVar6 * (this->resolution).super_Tuple2<pbrt::Point2,_int>.x + iVar5) *
                     (int)(this->channelNames).nStored) + (long)c];
    }
    else if (PVar2 == Half) {
      uVar1 = (this->p16).ptr
              [(long)((iVar6 * (this->resolution).super_Tuple2<pbrt::Point2,_int>.x + iVar5) *
                     (int)(this->channelNames).nStored) + (long)c].h;
      uVar7 = (uint)uVar1 << 0xd;
      if ((uVar7 & 0xf800000) == 0xf800000) {
        fVar8 = (float)(uVar7 | 0x70000000);
      }
      else if ((uVar7 & 0xf800000) == 0) {
        fVar8 = (float)(uVar7 | 0x38800000) + -6.1035156e-05;
      }
      else {
        fVar8 = (float)((uVar7 & 0xfffe000) + 0x38000000);
      }
      fVar8 = (float)((int)(short)uVar1 & 0x80000000U | (uint)fVar8);
    }
    else {
      if (PVar2 != U256) {
        LogFatal(Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.h"
                 ,0x110,"Unhandled PixelFormat");
      }
      vin.ptr = (this->p8).ptr +
                (long)c + (long)((iVar6 * (this->resolution).super_Tuple2<pbrt::Point2,_int>.x +
                                 iVar5) * (int)(this->channelNames).nStored);
      uVar3 = (this->encoding).
              super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
              .bits;
      if (uVar3 >> 0x31 == 0) {
        fVar8 = (float)*vin.ptr / 255.0;
      }
      else if ((uVar3 & 0xffff000000000000) == 0x2000000000000) {
        vin.n = 1;
        vout.n = 1;
        vout.ptr = &local_1c;
        sRGBColorEncoding::ToLinear((sRGBColorEncoding *)(uVar3 & 0xffffffffffff),vin,vout);
        fVar8 = local_1c;
      }
      else {
        vin_00.n = 1;
        vin_00.ptr = vin.ptr;
        vout_00.n = 1;
        vout_00.ptr = &local_1c;
        GammaColorEncoding::ToLinear((GammaColorEncoding *)(uVar3 & 0xffffffffffff),vin_00,vout_00);
        fVar8 = local_1c;
      }
    }
  }
  return fVar8;
}

Assistant:

PBRT_CPU_GPU
    Float GetChannel(Point2i p, int c, WrapMode2D wrapMode = WrapMode::Clamp) const {
        if (!RemapPixelCoords(&p, resolution, wrapMode))
            return 0;

        switch (format) {
        case PixelFormat::U256: {
            Float r;
            encoding.ToLinear({&p8[PixelOffset(p) + c], 1}, {&r, 1});
            return r;
        }
        case PixelFormat::Half:
            return Float(p16[PixelOffset(p) + c]);
        case PixelFormat::Float:
            return p32[PixelOffset(p) + c];
        default:
            LOG_FATAL("Unhandled PixelFormat");
            return 0;
        }
    }